

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void __thiscall
VectorFormatter<DefaultFormatter>::Ser<HashWriter,std::vector<CTxUndo,std::allocator<CTxUndo>>>
          (VectorFormatter<DefaultFormatter> *this,HashWriter *s,
          vector<CTxUndo,_std::allocator<CTxUndo>_> *v)

{
  vector<Coin,_std::allocator<Coin>_> *pvVar1;
  value_type *elem;
  vector<Coin,_std::allocator<Coin>_> *v_00;
  long in_FS_OFFSET;
  VectorFormatter<TxInUndoFormatter> local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  WriteCompactSize<HashWriter>
            (s,((long)(v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  v_00 = &((v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
           super__Vector_impl_data._M_start)->vprevout;
  pvVar1 = &((v->super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>)._M_impl.
             super__Vector_impl_data._M_finish)->vprevout;
  if (v_00 != pvVar1) {
    do {
      VectorFormatter<TxInUndoFormatter>::Ser<HashWriter,std::vector<Coin,std::allocator<Coin>>>
                (&local_29,s,v_00);
      v_00 = v_00 + 1;
    } while (v_00 != pvVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }